

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O1

float __thiscall sptk::reaper::LpcAnalyzer::WindowedRms(LpcAnalyzer *this,float *data,int size)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  GetWindow(this,size);
  fVar2 = 0.0;
  if (0 < size) {
    uVar1 = 0;
    do {
      fVar3 = (this->energywind_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar1] * data[uVar1];
      fVar2 = fVar2 + fVar3 * fVar3;
      uVar1 = uVar1 + 1;
    } while ((uint)size != uVar1);
  }
  fVar2 = fVar2 / (float)size;
  if (0.0 <= fVar2) {
    return SQRT(fVar2);
  }
  fVar2 = sqrtf(fVar2);
  return fVar2;
}

Assistant:

float LpcAnalyzer::WindowedRms(float* data, int size) {
  float sum, f;
  int i;

  GetWindow(size);
  for (i = 0, sum = 0.0; i < size; i++) {
    f = energywind_[i] * (*data++);
    sum += f * f;
  }
  return sqrt(sum / size);
}